

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration.c
# Opt level: O0

int registration_service_stop(registration_service_handle *rs)

{
  void *pvVar1;
  int iVar2;
  registration_service_priv *priv;
  registration_service_handle *rs_local;
  
  pvVar1 = rs->priv;
  mutex_lock((mutex_handle *)((long)pvVar1 + 0x20));
  *(undefined4 *)((long)pvVar1 + 0x58) = 3;
  worker_wake((worker_handle *)((long)pvVar1 + 0x28));
  mutex_unlock((mutex_handle *)((long)pvVar1 + 0x20));
  iVar2 = worker_join((worker_handle *)((long)pvVar1 + 0x28));
  return iVar2;
}

Assistant:

int registration_service_stop(struct registration_service_handle *rs)
{
	struct registration_service_priv *priv = rs->priv;

	mutex_lock(&priv->mutex);
	priv->status = REGISTRATION_STATUS_OFF;
	worker_wake(&priv->worker);
	mutex_unlock(&priv->mutex);

	return worker_join(&priv->worker);
}